

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::PatchPutRootValueNoLocalFastPath<false,Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  Type *pTVar1;
  byte *pbVar2;
  Type TVar3;
  ImplicitCallFlags IVar4;
  code *pcVar5;
  undefined8 requestContext;
  bool bVar6;
  BOOL BVar7;
  RecyclableObject *object;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  ImplicitCallFlags IVar10;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  object = VarTo<Js::RecyclableObject>(instance);
  local_a0 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a0,functionBody,inlineCache,inlineCacheIndex,true);
  if (info._8_8_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x94,
                                "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())",
                                "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()");
    if (!bVar6) goto LAB_00adb268;
    *puVar8 = 0;
  }
  requestContext = info._56_8_;
  if (info.inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x95,
                                "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                ,
                                "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                               );
    if (!bVar6) {
LAB_00adb268:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  bVar6 = PolymorphicInlineCache::TrySetProperty<false,true,true,false,false>
                    ((PolymorphicInlineCache *)info.inlineCache,object,propertyId,newValue,
                     (ScriptContext *)requestContext,(PropertyCacheOperationInfo *)0x0,
                     (InlineCache *)0x0,flags);
  if (!bVar6) {
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
    if ((bVar6) && (DAT_015bc46a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchPutRootValueNoLocalFastPath",propertyId,
                 (ScriptContext *)requestContext,object);
    }
    TVar3 = (functionBody->super_ParseableFunctionInfo).flags;
    IVar10 = ImplicitCall_None;
    if ((TVar3 & Flags_HasOnlyThisStatements) != Flags_None) {
      IVar10 = (*(ThreadContext **)(requestContext + 0x3b8))->implicitCallFlags;
      ThreadContext::ClearImplicitCallFlags(*(ThreadContext **)(requestContext + 0x3b8));
    }
    BVar7 = SetProperty_Internal<false>
                      (object,object,true,propertyId,newValue,(PropertyValueInfo *)local_a0,
                       (ScriptContext *)requestContext,flags);
    if (BVar7 == 0) {
      pbVar2 = (byte *)(*(long *)(requestContext + 0x3b8) + 0x1570);
      *pbVar2 = *pbVar2 | 0x41;
    }
    if ((TVar3 & Flags_HasOnlyThisStatements) != Flags_None) {
      pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      IVar4 = pSVar9->threadContext->implicitCallFlags;
      if (ImplicitCall_None < IVar4) {
        pTVar1 = &(functionBody->super_ParseableFunctionInfo).flags;
        *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|Flags_NonUserCode
                             |Flags_HasThis|Flags_HasTry|Flags_HasOrParentHasArguments|
                            Flags_StackNestedFunc);
      }
      *(ImplicitCallFlags *)(*(long *)(requestContext + 0x3b8) + 0x1570) = IVar4 | IVar10;
    }
  }
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutRootValueNoLocalFastPath(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutRootValueNoLocalFastPath);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject *object = VarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<!TInlineCache::IsPolymorphic, true, true, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, true, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutRootValueNoLocalFastPath"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::SetRootProperty(object, propertyId, newValue, &info, scriptContext, flags))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutRootValueNoLocalFastPath);
    }